

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::LDA_ZP_X(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  
  this->cycles = 4;
  uVar1 = GetByte(this);
  this->cycles = this->cycles - 1;
  bVar2 = ReadByte(this,(ushort)(byte)(uVar1 + this->X));
  this->A = bVar2;
  (this->field_6).ps = bVar2 & 0x80 | (bVar2 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDA_ZP_X()
{
    cycles = 4;
    uint8_t data = GetByte();
    data += X;
    cycles--;
    A = ReadByte(data);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}